

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userop.cc
# Opt level: O2

string * VolatileOp::appendSize(string *__return_storage_ptr__,string *base,int4 size)

{
  ostream *poVar1;
  char *__rhs;
  ostringstream s;
  
  switch(size) {
  case 1:
    __rhs = "_1";
    break;
  case 2:
    __rhs = "_2";
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar1 = std::operator<<((ostream *)&s,(string *)base);
    poVar1 = std::operator<<(poVar1,'_');
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::ostream::operator<<(poVar1,size);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    return __return_storage_ptr__;
  case 4:
    __rhs = "_4";
    break;
  case 8:
    __rhs = "_8";
  }
  std::operator+(__return_storage_ptr__,base,__rhs);
  return __return_storage_ptr__;
}

Assistant:

string VolatileOp::appendSize(const string &base,int4 size)

{
  if (size==1)
    return base + "_1";
  if (size==2)
    return base + "_2";
  if (size==4)
    return base + "_4";
  if (size==8)
    return base + "_8";
  ostringstream s;
  s << base << '_' << dec << size;
  return s.str();
}